

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  undefined1 *puVar2;
  long lVar3;
  int local_24;
  int i;
  char *name;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  argv_local._0_4_ = argc;
  testing::InitGoogleTest((int *)&argv_local,argv);
  local_24 = 1;
  while( true ) {
    if ((int)argv_local <= local_24) {
      puVar2 = (undefined1 *)manifold::ManifoldParams();
      *puVar2 = 1;
      lVar3 = manifold::ManifoldParams();
      *(undefined1 *)(lVar3 + 2) = 0;
      RegisterPolygonTests();
      iVar1 = RUN_ALL_TESTS();
      return iVar1;
    }
    if (*argv[local_24] != '-') break;
    switch(argv[local_24][1]) {
    case 'c':
      lVar3 = manifold::ManifoldParams();
      *(undefined1 *)(lVar3 + 1) = 1;
      break;
    default:
      fprintf(_stderr,"Unknown option: %s\n",argv[local_24]);
      print_usage();
      return 1;
    case 'e':
      printf("Export not possible because MANIFOLD_EXPORT compile flag is not set.\n");
      options.exportModels = true;
      break;
    case 'h':
      print_usage();
      return 0;
    case 'v':
      lVar3 = manifold::ManifoldParams();
      *(undefined4 *)(lVar3 + 8) = 1;
      if (argv[local_24][2] == 'v') {
        lVar3 = manifold::ManifoldParams();
        *(undefined4 *)(lVar3 + 8) = 2;
      }
    }
    local_24 = local_24 + 1;
  }
  fprintf(_stderr,"Unknown option: %s\n",argv[local_24]);
  print_usage();
  return 1;
}

Assistant:

int main(int argc, char** argv) {
  ::testing::InitGoogleTest(&argc, argv);

  const char* name = "test setup";
  FrameMarkStart(name);

  // warmup tbb for emscripten, according to
  // https://github.com/oneapi-src/oneTBB/blob/master/WASM_Support.md#limitations
#if defined(__EMSCRIPTEN__) && (MANIFOLD_PAR == 1)
  int num_threads = tbb::this_task_arena::max_concurrency();
  std::atomic<int> barrier{num_threads};
  tbb::parallel_for(
      0, num_threads,
      [&barrier](int) {
        barrier--;
        while (barrier > 0) {
          // Send browser thread to event loop
          std::this_thread::yield();
        }
      },
      tbb::static_partitioner{});
#endif

  for (int i = 1; i < argc; i++) {
    if (argv[i][0] != '-') {
      fprintf(stderr, "Unknown option: %s\n", argv[i]);
      print_usage();
      return 1;
    }
    switch (argv[i][1]) {
      case 'h':
        print_usage();
        return 0;
      case 'e':
#ifndef MANIFOLD_EXPORT
        printf(
            "Export not possible because MANIFOLD_EXPORT compile flag is not "
            "set.\n");
#endif
        options.exportModels = true;
        break;
      case 'v':
        manifold::ManifoldParams().verbose = 1;
        if (argv[i][2] == 'v') {
          manifold::ManifoldParams().verbose = 2;
        }
        break;
      case 'c':
        manifold::ManifoldParams().selfIntersectionChecks = true;
        break;
      default:
        fprintf(stderr, "Unknown option: %s\n", argv[i]);
        print_usage();
        return 1;
    }
  }

  manifold::ManifoldParams().intermediateChecks = true;
  manifold::ManifoldParams().processOverlaps = false;

  FrameMarkEnd(name);

  RegisterPolygonTests();
  return RUN_ALL_TESTS();
}